

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void * ggml_backend_buffer_get_base(ggml_backend_buffer_t buffer)

{
  long in_RDI;
  void *base;
  void *local_8;
  
  if (*(long *)(in_RDI + 0x58) == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)(**(code **)(in_RDI + 8))(in_RDI);
    if (local_8 == (void *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-backend.cpp"
                 ,0x7d,"GGML_ASSERT(%s) failed",
                 "base != NULL && \"backend buffer base cannot be NULL\"");
    }
  }
  return local_8;
}

Assistant:

void * ggml_backend_buffer_get_base(ggml_backend_buffer_t buffer) {
    // get_base is optional if the buffer is zero-sized
    if (buffer->size == 0) {
        return NULL;
    }

    void * base = buffer->iface.get_base(buffer);

    GGML_ASSERT(base != NULL && "backend buffer base cannot be NULL");

    return base;
}